

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O0

bool __thiscall GF2::WW<12UL>::Next(WW<12UL> *this,bool saveWeight)

{
  word wVar1;
  byte in_SIL;
  WW<12UL> *in_RDI;
  bool bVar2;
  bool in_stack_0000000f;
  size_t end;
  size_t pos;
  undefined7 in_stack_00000020;
  uint5 in_stack_ffffffffffffffc8;
  byte bVar3;
  undefined1 in_stack_ffffffffffffffcf;
  ulong local_28;
  ulong local_20;
  bool local_1;
  
  local_20 = 0;
  if ((in_SIL & 1) == 0) {
    while( true ) {
      bVar2 = false;
      if (local_20 == 0) {
        wVar1 = in_RDI->_words[0] + 1;
        in_RDI->_words[0] = wVar1;
        bVar2 = wVar1 == 0;
      }
      if (!bVar2) break;
      local_20 = local_20 + 1;
    }
    if (local_20 == 0xffffffffffffffff) {
      local_1 = true;
    }
    else if (local_20 == 1) {
      local_1 = false;
    }
    else {
      Trim(in_RDI);
      local_1 = in_RDI[local_20]._words[0] != 0;
    }
  }
  else {
    while( true ) {
      bVar3 = 0;
      if (local_20 < 0xc) {
        bVar2 = Test(in_RDI,local_20);
        bVar3 = bVar2 ^ 0xff;
      }
      if ((bVar3 & 1) == 0) break;
      local_20 = local_20 + 1;
    }
    if (local_20 == 0xc) {
      local_1 = false;
    }
    else {
      do {
        local_28 = local_20 + 1;
        bVar2 = false;
        if (local_28 < 0xc) {
          bVar2 = Test(in_RDI,local_28);
        }
        local_20 = local_28;
      } while (bVar2 != false);
      if (local_28 == 0xc) {
        First(in_RDI,CONCAT17(in_stack_ffffffffffffffcf,
                              CONCAT16(bVar3,(uint6)in_stack_ffffffffffffffc8)));
        local_1 = false;
      }
      else {
        Set((WW<12UL> *)CONCAT17(saveWeight,in_stack_00000020),pos,end,in_stack_0000000f);
        Set((WW<12UL> *)CONCAT17(saveWeight,in_stack_00000020),pos,end,in_stack_0000000f);
        Set(in_RDI,local_28,true);
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool Next(bool saveWeight = false)
	{	
		size_t pos = 0;
		if (!saveWeight)
		{
			// инкремент слова-как-числа
			for (; pos < _wcount && ++_words[pos] == 0; ++pos);
			// перенос не попал в последнее слово представления?
			if (pos + 1 < _wcount) 
				return true;
			// прошли последнее слово?
			if (pos == _wcount) 
				return false;
			// остановились в последнем слове
			Trim(); 
			return _words[pos] != 0;
		}
		// ищем начало серии из единиц
		for (; pos < _n && !Test(pos); ++pos);
		// единиц нет?
		if (pos == _n) 
			return false;
		// ищем окончание серии
		size_t end = pos + 1;
		for (; end < _n && Test(end); ++end);
		// серия справа?
		if (end == _n)
		{
			// возвращаемся к первому слову с данным весом
			First(end - pos);
			return false;
		}
		// разрываем серию
		Set(0, end - pos - 1, 1); 
		Set(end - pos - 1, end, 0);
		Set(end, 1);
		return true;
	}